

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O2

void __thiscall
btCollisionWorld::debugDrawObject
          (btCollisionWorld *this,btTransform *worldTransform,btCollisionShape *shape,
          btVector3 *color)

{
  undefined8 *puVar1;
  int iVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  btScalar bVar6;
  short sVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar11;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long *plVar12;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  int v;
  ulong uVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  code *UNRECOVERED_JUMPTABLE;
  long lVar17;
  long lVar18;
  btBoxShape *boxShape;
  long lVar19;
  float fVar20;
  btVector3 bVar21;
  float local_158;
  float fStack_154;
  btConcaveShape *concaveMesh;
  btVector3 wa;
  btVector3 halfExtents;
  btVector3 wb;
  btVector3 b;
  btVector3 local_40;
  undefined4 extraout_var_06;
  
  iVar8 = (*this->_vptr_btCollisionWorld[5])();
  if (CONCAT44(extraout_var,iVar8) != 0) {
    iVar8 = (*this->_vptr_btCollisionWorld[5])(this);
    sVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar8) + 0x70))
                      ((long *)CONCAT44(extraout_var_00,iVar8));
    if (sVar7 < 0) {
      iVar8 = (*this->_vptr_btCollisionWorld[5])(this);
      (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar8) + 0x80))
                ((long *)CONCAT44(extraout_var_01,iVar8),worldTransform);
    }
  }
  iVar8 = shape->m_shapeType;
  switch(iVar8) {
  case 0:
    bVar21 = btBoxShape::getHalfExtentsWithMargin((btBoxShape *)shape);
    halfExtents.m_floats[0] = bVar21.m_floats[0];
    halfExtents.m_floats[1] = bVar21.m_floats[1];
    halfExtents.m_floats[2] = bVar21.m_floats[2];
    bVar6 = halfExtents.m_floats[2];
    halfExtents.m_floats[3] = bVar21.m_floats[3];
    iVar8 = (*this->_vptr_btCollisionWorld[5])(this);
    b.m_floats._0_8_ = bVar21.m_floats._0_8_ ^ 0x8000000080000000;
    b.m_floats[2] = -bVar6;
    b.m_floats[3] = 0.0;
    (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar8) + 0xa0))
              ((long *)CONCAT44(extraout_var_02,iVar8),&b,&halfExtents,worldTransform,color);
    return;
  case 8:
    (*shape->_vptr_btCollisionShape[0xc])(shape);
    iVar8 = (*this->_vptr_btCollisionWorld[5])(this);
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)CONCAT44(extraout_var_07,iVar8) + 0x30);
    (*UNRECOVERED_JUMPTABLE)
              ((long *)CONCAT44(extraout_var_07,iVar8),worldTransform,color,UNRECOVERED_JUMPTABLE);
    return;
  case 9:
    halfExtents.m_floats[0] = 1.0;
    halfExtents.m_floats[1] = 0.0;
    halfExtents.m_floats[2] = 0.0;
    halfExtents.m_floats[3] = 0.0;
    for (iVar8 = *(int *)&shape[3].field_0xc; 0 < iVar8; iVar8 = iVar8 + -1) {
      iVar9 = (*this->_vptr_btCollisionWorld[5])();
      btTransform::operator*((btTransform *)&b,worldTransform,(btTransform *)&halfExtents);
      (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar9) + 0x30))
                ((long *)CONCAT44(extraout_var_09,iVar9),(btTransform *)&b,color);
    }
    return;
  case 10:
    uVar3 = *(undefined4 *)((long)&shape[2]._vptr_btCollisionShape + 4);
    iVar8 = (*this->_vptr_btCollisionWorld[5])(this);
    plVar12 = (long *)CONCAT44(extraout_var_06,iVar8);
    UNRECOVERED_JUMPTABLE = *(code **)(*plVar12 + 0xa8);
    break;
  case 0xb:
    uVar3 = *(undefined4 *)((long)&shape[2].m_userPointer + 4);
    iVar8 = (*this->_vptr_btCollisionWorld[5])(this);
    plVar12 = (long *)CONCAT44(extraout_var_08,iVar8);
    UNRECOVERED_JUMPTABLE = *(code **)(*plVar12 + 0xb8);
    break;
  case 0xd:
    uVar3 = *(undefined4 *)((long)&shape[2]._vptr_btCollisionShape + 4);
    (*shape->_vptr_btCollisionShape[0x17])(shape);
    bVar21 = btCylinderShape::getHalfExtentsWithMargin((btCylinderShape *)shape);
    halfExtents.m_floats[0] = bVar21.m_floats[0];
    halfExtents.m_floats[1] = bVar21.m_floats[1];
    halfExtents.m_floats[2] = bVar21.m_floats[2];
    halfExtents.m_floats[3] = bVar21.m_floats[3];
    iVar8 = (*this->_vptr_btCollisionWorld[5])(this);
    plVar12 = (long *)CONCAT44(extraout_var_10,iVar8);
    UNRECOVERED_JUMPTABLE = *(code **)(*plVar12 + 0xb0);
    break;
  default:
    if (iVar8 == 0x1c) {
      iVar8 = (*this->_vptr_btCollisionWorld[5])(this);
      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)CONCAT44(extraout_var_11,iVar8) + 0xc0);
      (*UNRECOVERED_JUMPTABLE)
                ((long *)CONCAT44(extraout_var_11,iVar8),shape + 2,worldTransform,color,
                 UNRECOVERED_JUMPTABLE);
      return;
    }
    if (iVar8 == 0x1f) {
      uVar13 = (ulong)*(uint *)((long)&shape[1]._vptr_btCollisionShape + 4);
      lVar19 = uVar13 * 0x58 + -0x18;
      for (; 0 < (int)uVar13; uVar13 = (ulong)((int)uVar13 - 1)) {
        puVar1 = (undefined8 *)((long)shape[1].m_userPointer + lVar19 + -0x40);
        uVar4 = *puVar1;
        uVar5 = puVar1[1];
        halfExtents.m_floats[0] = (btScalar)uVar4;
        halfExtents.m_floats[1] = (btScalar)((ulong)uVar4 >> 0x20);
        halfExtents.m_floats[2] = (btScalar)uVar5;
        halfExtents.m_floats[3] = (btScalar)((ulong)uVar5 >> 0x20);
        uVar4 = *(undefined8 *)((long)shape[1].m_userPointer + lVar19);
        btTransform::operator*((btTransform *)&b,worldTransform,(btTransform *)&halfExtents);
        (*this->_vptr_btCollisionWorld[7])(this,(btTransform *)&b,uVar4,color);
        lVar19 = lVar19 + -0x58;
      }
      return;
    }
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 0xc:
    if (iVar8 < 7) {
      lVar19 = *(long *)&shape[2].m_shapeType;
      if (lVar19 == 0) {
        for (uVar10 = 0; iVar8 = (*shape->_vptr_btCollisionShape[0x19])(shape), (int)uVar10 < iVar8;
            uVar10 = uVar10 + 1) {
          (*shape->_vptr_btCollisionShape[0x1a])(shape,(ulong)uVar10,&halfExtents,&b);
          wa = btTransform::operator()(worldTransform,&halfExtents);
          wb = btTransform::operator()(worldTransform,&b);
          iVar8 = (*this->_vptr_btCollisionWorld[5])(this);
          (**(code **)(*(long *)CONCAT44(extraout_var_12,iVar8) + 0x20))
                    ((long *)CONCAT44(extraout_var_12,iVar8),&wa,&wb,color);
        }
      }
      else {
        for (lVar16 = 0; lVar16 < *(int *)(lVar19 + 0x2c); lVar16 = lVar16 + 1) {
          halfExtents.m_floats[0] = 0.0;
          halfExtents.m_floats[1] = 0.0;
          halfExtents.m_floats[2] = 0.0;
          halfExtents.m_floats[3] = 0.0;
          lVar11 = *(long *)(lVar19 + 0x38);
          lVar17 = lVar16 * 0x30;
          iVar8 = *(int *)(lVar11 + 4 + lVar17);
          if ((long)iVar8 == 0) {
            halfExtents.m_floats[0] = 0.0;
            halfExtents.m_floats[1] = 0.0;
            halfExtents.m_floats[2] = 0.0;
          }
          else {
            iVar15 = *(int *)(*(long *)(lVar11 + lVar17 + 0x10) + -4 + (long)iVar8 * 4);
            iVar9 = iVar8;
            for (lVar14 = 0; lVar14 < iVar9; lVar14 = lVar14 + 1) {
              iVar2 = *(int *)(*(long *)(lVar11 + 0x10 + lVar17) + lVar14 * 4);
              lVar11 = *(long *)(lVar19 + 0x18);
              lVar18 = (long)iVar2 * 0x10;
              halfExtents.m_floats[0] = *(float *)(lVar11 + lVar18) + halfExtents.m_floats[0];
              halfExtents.m_floats[1] = *(float *)(lVar11 + 4 + lVar18) + halfExtents.m_floats[1];
              halfExtents.m_floats[2] = *(float *)(lVar11 + 8 + lVar18) + halfExtents.m_floats[2];
              iVar9 = (*this->_vptr_btCollisionWorld[5])(this);
              b = btTransform::operator()
                            (worldTransform,
                             (btVector3 *)((long)iVar15 * 0x10 + *(long *)(lVar19 + 0x18)));
              wa = btTransform::operator()
                             (worldTransform,(btVector3 *)(lVar18 + *(long *)(lVar19 + 0x18)));
              (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar9) + 0x20))
                        ((long *)CONCAT44(extraout_var_03,iVar9),&b,&wa,color);
              lVar11 = *(long *)(lVar19 + 0x38);
              iVar9 = *(int *)(lVar11 + 4 + lVar17);
              iVar15 = iVar2;
            }
          }
          fVar20 = 1.0 / (float)iVar8;
          halfExtents.m_floats[0] = fVar20 * halfExtents.m_floats[0];
          halfExtents.m_floats[1] = fVar20 * halfExtents.m_floats[1];
          halfExtents.m_floats[2] = fVar20 * halfExtents.m_floats[2];
          iVar8 = (*this->_vptr_btCollisionWorld[5])(this);
          uVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar8) + 0x70))
                             ((long *)CONCAT44(extraout_var_04,iVar8));
          if ((uVar10 >> 0xe & 1) != 0) {
            b.m_floats = (btScalar  [4])ZEXT816(0x3f8000003f800000);
            fVar20 = *(float *)(*(long *)(lVar19 + 0x38) + 0x28 + lVar17);
            uVar4 = *(undefined8 *)(*(long *)(lVar19 + 0x38) + 0x20 + lVar17);
            iVar8 = (*this->_vptr_btCollisionWorld[5])(this);
            wa = btTransform::operator()(worldTransform,&halfExtents);
            local_158 = (float)uVar4;
            fStack_154 = (float)((ulong)uVar4 >> 0x20);
            local_40.m_floats[0] = halfExtents.m_floats[0] + local_158;
            local_40.m_floats[1] = halfExtents.m_floats[1] + fStack_154;
            local_40.m_floats[2] = fVar20 + halfExtents.m_floats[2];
            local_40.m_floats[3] = 0.0;
            wb = btTransform::operator()(worldTransform,&local_40);
            (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar8) + 0x20))
                      ((long *)CONCAT44(extraout_var_05,iVar8),&wa,&wb,&b);
          }
        }
      }
    }
    iVar8 = shape->m_shapeType;
    if (iVar8 - 0x15U < 9) {
      b.m_floats[2] = 1e+18;
      b.m_floats[3] = 0.0;
      b.m_floats[0] = 1e+18;
      b.m_floats[1] = 1e+18;
      wa.m_floats[2] = -1e+18;
      wa.m_floats[3] = 0.0;
      wa.m_floats[0] = -1e+18;
      wa.m_floats[1] = -1e+18;
      (*this->_vptr_btCollisionWorld[5])();
      halfExtents.m_floats[0] = 2.828997e-39;
      halfExtents.m_floats[1] = 0.0;
      halfExtents.m_floats[2] = 2.829065e-39;
      halfExtents.m_floats[3] = 0.0;
      (*shape->_vptr_btCollisionShape[0x10])(shape,&halfExtents,&wa,&b);
      DebugDrawcallback::~DebugDrawcallback((DebugDrawcallback *)&halfExtents);
      iVar8 = shape->m_shapeType;
    }
    if (iVar8 == 3) {
      b.m_floats[2] = 1e+18;
      b.m_floats[3] = 0.0;
      b.m_floats[0] = 1e+18;
      b.m_floats[1] = 1e+18;
      wa.m_floats[2] = -1e+18;
      wa.m_floats[3] = 0.0;
      wa.m_floats[0] = -1e+18;
      wa.m_floats[1] = -1e+18;
      (*this->_vptr_btCollisionWorld[5])();
      halfExtents.m_floats[0] = 2.828997e-39;
      halfExtents.m_floats[1] = 0.0;
      halfExtents.m_floats[2] = 2.829065e-39;
      halfExtents.m_floats[3] = 0.0;
      (**(code **)(**(long **)&shape[3].m_userIndex + 0x10))
                (*(long **)&shape[3].m_userIndex,halfExtents.m_floats + 2,&wa,&b);
      DebugDrawcallback::~DebugDrawcallback((DebugDrawcallback *)&halfExtents);
    }
    return;
  }
  (*UNRECOVERED_JUMPTABLE)(plVar12,uVar3,worldTransform,color,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void btCollisionWorld::debugDrawObject(const btTransform& worldTransform, const btCollisionShape* shape, const btVector3& color)
{
	// Draw a small simplex at the center of the object
	if (getDebugDrawer() && getDebugDrawer()->getDebugMode() & btIDebugDraw::DBG_DrawFrames)
	{
		getDebugDrawer()->drawTransform(worldTransform,1);
	}

	if (shape->getShapeType() == COMPOUND_SHAPE_PROXYTYPE)
	{
		const btCompoundShape* compoundShape = static_cast<const btCompoundShape*>(shape);
		for (int i=compoundShape->getNumChildShapes()-1;i>=0;i--)
		{
			btTransform childTrans = compoundShape->getChildTransform(i);
			const btCollisionShape* colShape = compoundShape->getChildShape(i);
			debugDrawObject(worldTransform*childTrans,colShape,color);
		}

	} else
	{

        switch (shape->getShapeType())
        {

        case BOX_SHAPE_PROXYTYPE:
            {
                const btBoxShape* boxShape = static_cast<const btBoxShape*>(shape);
                btVector3 halfExtents = boxShape->getHalfExtentsWithMargin();
                getDebugDrawer()->drawBox(-halfExtents,halfExtents,worldTransform,color);
                break;
            }

        case SPHERE_SHAPE_PROXYTYPE:
            {
                const btSphereShape* sphereShape = static_cast<const btSphereShape*>(shape);
                btScalar radius = sphereShape->getMargin();//radius doesn't include the margin, so draw with margin

                getDebugDrawer()->drawSphere(radius, worldTransform, color);
                break;
            }
        case MULTI_SPHERE_SHAPE_PROXYTYPE:
            {
                const btMultiSphereShape* multiSphereShape = static_cast<const btMultiSphereShape*>(shape);

                btTransform childTransform;
                childTransform.setIdentity();

                for (int i = multiSphereShape->getSphereCount()-1; i>=0;i--)
                {
                    childTransform.setOrigin(multiSphereShape->getSpherePosition(i));
                    getDebugDrawer()->drawSphere(multiSphereShape->getSphereRadius(i), worldTransform*childTransform, color);
                }

                break;
            }
        case CAPSULE_SHAPE_PROXYTYPE:
            {
                const btCapsuleShape* capsuleShape = static_cast<const btCapsuleShape*>(shape);

                btScalar radius = capsuleShape->getRadius();
                btScalar halfHeight = capsuleShape->getHalfHeight();

                int upAxis = capsuleShape->getUpAxis();
                getDebugDrawer()->drawCapsule(radius, halfHeight, upAxis, worldTransform, color);
                break;
            }
        case CONE_SHAPE_PROXYTYPE:
            {
                const btConeShape* coneShape = static_cast<const btConeShape*>(shape);
                btScalar radius = coneShape->getRadius();//+coneShape->getMargin();
                btScalar height = coneShape->getHeight();//+coneShape->getMargin();

                int upAxis= coneShape->getConeUpIndex();
                getDebugDrawer()->drawCone(radius, height, upAxis, worldTransform, color);
                break;

            }
        case CYLINDER_SHAPE_PROXYTYPE:
            {
                const btCylinderShape* cylinder = static_cast<const btCylinderShape*>(shape);
                int upAxis = cylinder->getUpAxis();
                btScalar radius = cylinder->getRadius();
                btScalar halfHeight = cylinder->getHalfExtentsWithMargin()[upAxis];
                getDebugDrawer()->drawCylinder(radius, halfHeight, upAxis, worldTransform, color);
                break;
            }

        case STATIC_PLANE_PROXYTYPE:
            {
                const btStaticPlaneShape* staticPlaneShape = static_cast<const btStaticPlaneShape*>(shape);
                btScalar planeConst = staticPlaneShape->getPlaneConstant();
                const btVector3& planeNormal = staticPlaneShape->getPlaneNormal();
                getDebugDrawer()->drawPlane(planeNormal, planeConst,worldTransform, color);
                break;

            }
        default:
            {

                /// for polyhedral shapes
                if (shape->isPolyhedral())
                {
                    btPolyhedralConvexShape* polyshape = (btPolyhedralConvexShape*) shape;
                    
                    int i;
                    if (polyshape->getConvexPolyhedron())
                    {
                        const btConvexPolyhedron* poly = polyshape->getConvexPolyhedron();
                        for (i=0;i<poly->m_faces.size();i++)
                        {
                            btVector3 centroid(0,0,0);
                            int numVerts = poly->m_faces[i].m_indices.size();
                            if (numVerts)
                            {
                                int lastV = poly->m_faces[i].m_indices[numVerts-1];
                                for (int v=0;v<poly->m_faces[i].m_indices.size();v++)
                                {
                                    int curVert = poly->m_faces[i].m_indices[v];
                                    centroid+=poly->m_vertices[curVert];
                                    getDebugDrawer()->drawLine(worldTransform*poly->m_vertices[lastV],worldTransform*poly->m_vertices[curVert],color);
                                    lastV = curVert;
                                }
                            }
                            centroid*= btScalar(1.f)/btScalar(numVerts);
                            if (getDebugDrawer()->getDebugMode() & btIDebugDraw::DBG_DrawNormals)
                            {
                                btVector3 normalColor(1,1,0);
                                btVector3 faceNormal(poly->m_faces[i].m_plane[0],poly->m_faces[i].m_plane[1],poly->m_faces[i].m_plane[2]);
                                getDebugDrawer()->drawLine(worldTransform*centroid,worldTransform*(centroid+faceNormal),normalColor);
                            }
                            
                        }
                        
                        
                    } else
                    {
                        for (i=0;i<polyshape->getNumEdges();i++)
                        {
                            btVector3 a,b;
                            polyshape->getEdge(i,a,b);
                            btVector3 wa = worldTransform * a;
                            btVector3 wb = worldTransform * b;
                            getDebugDrawer()->drawLine(wa,wb,color);
                        }
                    }
                    
                    
                }
                    
                if (shape->isConcave())
                {
                    btConcaveShape* concaveMesh = (btConcaveShape*) shape;

                    ///@todo pass camera, for some culling? no -> we are not a graphics lib
                    btVector3 aabbMax(btScalar(BT_LARGE_FLOAT),btScalar(BT_LARGE_FLOAT),btScalar(BT_LARGE_FLOAT));
                    btVector3 aabbMin(btScalar(-BT_LARGE_FLOAT),btScalar(-BT_LARGE_FLOAT),btScalar(-BT_LARGE_FLOAT));

                    DebugDrawcallback drawCallback(getDebugDrawer(),worldTransform,color);
                    concaveMesh->processAllTriangles(&drawCallback,aabbMin,aabbMax);

                }

                if (shape->getShapeType() == CONVEX_TRIANGLEMESH_SHAPE_PROXYTYPE)
                {
                    btConvexTriangleMeshShape* convexMesh = (btConvexTriangleMeshShape*) shape;
                    //todo: pass camera for some culling			
                    btVector3 aabbMax(btScalar(BT_LARGE_FLOAT),btScalar(BT_LARGE_FLOAT),btScalar(BT_LARGE_FLOAT));
                    btVector3 aabbMin(btScalar(-BT_LARGE_FLOAT),btScalar(-BT_LARGE_FLOAT),btScalar(-BT_LARGE_FLOAT));
                    //DebugDrawcallback drawCallback;
                    DebugDrawcallback drawCallback(getDebugDrawer(),worldTransform,color);
                    convexMesh->getMeshInterface()->InternalProcessAllTriangles(&drawCallback,aabbMin,aabbMax);
                }


                
            }
       
		}
	}
}